

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false>>
::
insert_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false>>
           *this,vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *column)

{
  uint uVar1;
  uint uVar2;
  Characteristic *pCVar3;
  logic_error *this_00;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *column_local;
  Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
  *this_local;
  
  pCVar3 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_characteristic
                     (*(Zp_field_operators<unsigned_int,_void> **)this);
  uVar1 = *pCVar3;
  uVar2 = Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>
          ::get_null_value<unsigned_int>();
  if (uVar1 != uVar2) {
    Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false>>>
    ::
    insert_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
              ((Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false>>>
                *)(this + 8),column);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,
             "Matrix::insert_column - Columns cannot be initialized if the coefficient field characteristic is not specified."
            );
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline void Matrix<PersistenceMatrixOptions>::insert_column(const Container& column)
{
  if constexpr (!PersistenceMatrixOptions::is_z2){
    GUDHI_CHECK(colSettings_->operators.get_characteristic() != get_null_value<Characteristic>(),
                std::logic_error("Matrix::insert_column - Columns cannot be initialized if the coefficient field "
                                 "characteristic is not specified."));
  }

  static_assert(
      !isNonBasic,
      "'insert_column' not available for the chosen options. The input has to be in the form of a cell boundary.");
  matrix_.insert_column(column);
}